

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-write-queue-order.c
# Opt level: O1

int run_test_tcp_write_queue_order(void)

{
  int iVar1;
  int extraout_EAX;
  uv_tcp_t *loop;
  uv_loop_t *puVar2;
  uv_loop_t *unaff_RBX;
  int iVar3;
  sockaddr *addr_00;
  int *value;
  uv_stream_t *handle;
  char *pcVar4;
  dword *pdVar5;
  int buffer_size;
  sockaddr_in addr;
  uv_connect_t connect_req;
  uv_buf_t uStack_c0;
  uv_loop_t *puStack_b0;
  int local_7c;
  sockaddr_in local_78;
  
  local_7c = 0x4000;
  pcVar4 = "0.0.0.0";
  iVar3 = 0x23a3;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)&stack0xffffffffffffff98);
  if (iVar1 == 0) {
    loop = (uv_tcp_t *)uv_default_loop();
    iVar3 = 0x3495b0;
    iVar1 = uv_tcp_init((uv_loop_t *)loop,&server);
    if (iVar1 != 0) goto LAB_001721cf;
    loop = &server;
    addr_00 = (sockaddr *)&stack0xffffffffffffff98;
    iVar1 = uv_tcp_bind(&server,addr_00,0);
    iVar3 = (int)addr_00;
    if (iVar1 != 0) goto LAB_001721d4;
    loop = &server;
    iVar3 = 0x80;
    iVar1 = uv_listen((uv_stream_t *)&server,0x80,connection_cb);
    if (iVar1 != 0) goto LAB_001721d9;
    loop = (uv_tcp_t *)0x1a4b5a;
    iVar3 = 0x23a3;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_78);
    if (iVar1 != 0) goto LAB_001721de;
    loop = (uv_tcp_t *)uv_default_loop();
    iVar3 = 0x3494a0;
    iVar1 = uv_tcp_init((uv_loop_t *)loop,&client);
    if (iVar1 != 0) goto LAB_001721e3;
    iVar3 = 0x3494a0;
    loop = (uv_tcp_t *)&stack0xffffffffffffff98;
    iVar1 = uv_tcp_connect((uv_connect_t *)loop,&client,(sockaddr *)&local_78,connect_cb);
    if (iVar1 != 0) goto LAB_001721e8;
    loop = &client;
    value = &local_7c;
    iVar1 = uv_send_buffer_size((uv_handle_t *)&client,value);
    iVar3 = (int)value;
    if (iVar1 != 0) goto LAB_001721ed;
    loop = (uv_tcp_t *)uv_default_loop();
    iVar3 = 0;
    iVar1 = uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001721f2;
    if (connect_cb_called != 1) goto LAB_001721f7;
    if (connection_cb_called != 1) goto LAB_001721fc;
    if (write_callbacks < 1) goto LAB_00172201;
    if (write_cancelled_callbacks < 1) goto LAB_00172206;
    if (write_cancelled_callbacks + write_callbacks + write_error_callbacks != 10000)
    goto LAB_0017220b;
    if (close_cb_called != 3) goto LAB_00172210;
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    iVar3 = 0;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    loop = (uv_tcp_t *)uv_default_loop();
    iVar1 = uv_loop_close((uv_loop_t *)loop);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_tcp_write_queue_order_cold_1();
    loop = (uv_tcp_t *)pcVar4;
LAB_001721cf:
    run_test_tcp_write_queue_order_cold_2();
LAB_001721d4:
    run_test_tcp_write_queue_order_cold_3();
LAB_001721d9:
    run_test_tcp_write_queue_order_cold_4();
LAB_001721de:
    run_test_tcp_write_queue_order_cold_5();
LAB_001721e3:
    run_test_tcp_write_queue_order_cold_6();
LAB_001721e8:
    run_test_tcp_write_queue_order_cold_7();
LAB_001721ed:
    run_test_tcp_write_queue_order_cold_8();
LAB_001721f2:
    run_test_tcp_write_queue_order_cold_9();
LAB_001721f7:
    run_test_tcp_write_queue_order_cold_10();
LAB_001721fc:
    run_test_tcp_write_queue_order_cold_11();
LAB_00172201:
    run_test_tcp_write_queue_order_cold_12();
LAB_00172206:
    run_test_tcp_write_queue_order_cold_13();
LAB_0017220b:
    run_test_tcp_write_queue_order_cold_14();
LAB_00172210:
    run_test_tcp_write_queue_order_cold_15();
  }
  run_test_tcp_write_queue_order_cold_16();
  puVar2 = (uv_loop_t *)loop;
  puStack_b0 = unaff_RBX;
  if (iVar3 == 0) {
    connect_cb_called = connect_cb_called + 1;
    uStack_c0 = uv_buf_init(connect_cb::base,0x400);
    pdVar5 = (dword *)0x0;
    while( true ) {
      puVar2 = (uv_loop_t *)((long)write_requests[0].reserved + (long)(pdVar5 + -4));
      handle = (uv_stream_t *)((uv_loop_t *)loop)->pending_queue[0];
      iVar1 = uv_write((uv_write_t *)puVar2,handle,&uStack_c0,1,write_cb);
      iVar3 = (int)handle;
      if (iVar1 != 0) break;
      pdVar5 = pdVar5 + 0x30;
      if (pdVar5 == &DWORD_001d4c00) {
        return 0;
      }
    }
    connect_cb_cold_2();
  }
  connect_cb_cold_1();
  if (iVar3 == 0) {
    iVar1 = uv_tcp_init(*(uv_loop_t **)&puVar2->active_handles,&incoming);
    if (iVar1 != 0) goto LAB_00172316;
    iVar1 = uv_accept((uv_stream_t *)puVar2,(uv_stream_t *)&incoming);
    if (iVar1 != 0) goto LAB_0017231b;
    puVar2 = uv_default_loop();
    iVar1 = uv_timer_init(puVar2,&timer);
    if (iVar1 == 0) {
      iVar1 = uv_timer_start(&timer,timer_cb,1000,0);
      if (iVar1 == 0) {
        connection_cb_called = connection_cb_called + 1;
        return 0;
      }
      goto LAB_00172325;
    }
  }
  else {
    connection_cb_cold_1();
LAB_00172316:
    connection_cb_cold_2();
LAB_0017231b:
    connection_cb_cold_3();
  }
  connection_cb_cold_4();
LAB_00172325:
  connection_cb_cold_5();
  uv_close((uv_handle_t *)&client,close_cb);
  uv_close((uv_handle_t *)&server,close_cb);
  uv_close((uv_handle_t *)&incoming,close_cb);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(tcp_write_queue_order) {
  uv_connect_t connect_req;
  struct sockaddr_in addr;
  int buffer_size = 16 * 1024;

  start_server();

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  ASSERT(0 == uv_tcp_init(uv_default_loop(), &client));
  ASSERT(0 == uv_tcp_connect(&connect_req,
                             &client,
                             (struct sockaddr*) &addr,
                             connect_cb));
  ASSERT(0 == uv_send_buffer_size((uv_handle_t*) &client, &buffer_size));

  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT(connect_cb_called == 1);
  ASSERT(connection_cb_called == 1);
  ASSERT(write_callbacks > 0);
  ASSERT(write_cancelled_callbacks > 0);
  ASSERT(write_callbacks +
         write_error_callbacks +
         write_cancelled_callbacks == REQ_COUNT);
  ASSERT(close_cb_called == 3);

  MAKE_VALGRIND_HAPPY();
  return 0;
}